

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3PendingListAppendVarint(PendingList **pp,sqlite3_int64 i)

{
  int iVar1;
  PendingList *pPStack_28;
  int nNew;
  PendingList *p;
  sqlite3_int64 i_local;
  PendingList **pp_local;
  
  pPStack_28 = *pp;
  if (pPStack_28 == (PendingList *)0x0) {
    pPStack_28 = (PendingList *)sqlite3_malloc(0x94);
    if (pPStack_28 == (PendingList *)0x0) {
      return 7;
    }
    pPStack_28->nSpace = 100;
    pPStack_28->aData = (char *)(pPStack_28 + 1);
    pPStack_28->nData = 0;
  }
  else if (pPStack_28->nSpace < pPStack_28->nData + 0xb) {
    iVar1 = pPStack_28->nSpace * 2;
    pPStack_28 = (PendingList *)sqlite3_realloc(pPStack_28,iVar1 + 0x30);
    if (pPStack_28 == (PendingList *)0x0) {
      sqlite3_free(*pp);
      *pp = (PendingList *)0x0;
      return 7;
    }
    pPStack_28->nSpace = iVar1;
    pPStack_28->aData = (char *)(pPStack_28 + 1);
  }
  iVar1 = sqlite3Fts3PutVarint(pPStack_28->aData + pPStack_28->nData,i);
  pPStack_28->nData = iVar1 + pPStack_28->nData;
  pPStack_28->aData[pPStack_28->nData] = '\0';
  *pp = pPStack_28;
  return 0;
}

Assistant:

static int fts3PendingListAppendVarint(
  PendingList **pp,               /* IN/OUT: Pointer to PendingList struct */
  sqlite3_int64 i                 /* Value to append to data */
){
  PendingList *p = *pp;

  /* Allocate or grow the PendingList as required. */
  if( !p ){
    p = sqlite3_malloc(sizeof(*p) + 100);
    if( !p ){
      return SQLITE_NOMEM;
    }
    p->nSpace = 100;
    p->aData = (char *)&p[1];
    p->nData = 0;
  }
  else if( p->nData+FTS3_VARINT_MAX+1>p->nSpace ){
    int nNew = p->nSpace * 2;
    p = sqlite3_realloc(p, sizeof(*p) + nNew);
    if( !p ){
      sqlite3_free(*pp);
      *pp = 0;
      return SQLITE_NOMEM;
    }
    p->nSpace = nNew;
    p->aData = (char *)&p[1];
  }

  /* Append the new serialized varint to the end of the list. */
  p->nData += sqlite3Fts3PutVarint(&p->aData[p->nData], i);
  p->aData[p->nData] = '\0';
  *pp = p;
  return SQLITE_OK;
}